

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::reLoad(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int32_t iVar16;
  cpp_dec_float<100U,_int,_void> *pcVar17;
  
  pcVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
  uVar1 = (pcVar17->data)._M_elems[1];
  uVar2 = (pcVar17->data)._M_elems[2];
  uVar3 = (pcVar17->data)._M_elems[3];
  uVar4 = (pcVar17->data)._M_elems[4];
  uVar5 = (pcVar17->data)._M_elems[5];
  uVar6 = (pcVar17->data)._M_elems[6];
  uVar7 = (pcVar17->data)._M_elems[7];
  uVar8 = (pcVar17->data)._M_elems[8];
  uVar9 = (pcVar17->data)._M_elems[9];
  uVar10 = (pcVar17->data)._M_elems[10];
  uVar11 = (pcVar17->data)._M_elems[0xb];
  uVar12 = (pcVar17->data)._M_elems[0xc];
  uVar13 = (pcVar17->data)._M_elems[0xd];
  uVar14 = (pcVar17->data)._M_elems[0xe];
  uVar15 = (pcVar17->data)._M_elems[0xf];
  (this->m_nonbasicValue).m_backend.data._M_elems[0] = (pcVar17->data)._M_elems[0];
  (this->m_nonbasicValue).m_backend.data._M_elems[1] = uVar1;
  (this->m_nonbasicValue).m_backend.data._M_elems[2] = uVar2;
  (this->m_nonbasicValue).m_backend.data._M_elems[3] = uVar3;
  (this->m_nonbasicValue).m_backend.data._M_elems[4] = uVar4;
  (this->m_nonbasicValue).m_backend.data._M_elems[5] = uVar5;
  (this->m_nonbasicValue).m_backend.data._M_elems[6] = uVar6;
  (this->m_nonbasicValue).m_backend.data._M_elems[7] = uVar7;
  (this->m_nonbasicValue).m_backend.data._M_elems[8] = uVar8;
  (this->m_nonbasicValue).m_backend.data._M_elems[9] = uVar9;
  (this->m_nonbasicValue).m_backend.data._M_elems[10] = uVar10;
  (this->m_nonbasicValue).m_backend.data._M_elems[0xb] = uVar11;
  (this->m_nonbasicValue).m_backend.data._M_elems[0xc] = uVar12;
  (this->m_nonbasicValue).m_backend.data._M_elems[0xd] = uVar13;
  (this->m_nonbasicValue).m_backend.data._M_elems[0xe] = uVar14;
  (this->m_nonbasicValue).m_backend.data._M_elems[0xf] = uVar15;
  (this->m_nonbasicValue).m_backend.exp = pcVar17->exp;
  (this->m_nonbasicValue).m_backend.neg = pcVar17->neg;
  iVar16 = pcVar17->prec_elem;
  (this->m_nonbasicValue).m_backend.fpclass = pcVar17->fpclass;
  (this->m_nonbasicValue).m_backend.prec_elem = iVar16;
  this->m_nonbasicValueUpToDate = false;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x77])(this);
  (*(this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxBasisBase[8])
            (&this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            );
  (this->
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).theLP = this;
  this->m_status = UNKNOWN;
  if (this->thepricer !=
      (SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    (*this->thepricer->_vptr_SPxPricer[2])();
  }
  if (this->theratiotester !=
      (SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    (*this->theratiotester->_vptr_SPxRatioTester[2])();
    return;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::reLoad()
{
   forceRecompNonbasicValue();
   unInit();
   this->unLoad();
   this->theLP = this;
   m_status = SPxSolverBase<R>::UNKNOWN;

   if(thepricer)
      thepricer->clear();

   if(theratiotester)
      theratiotester->clear();
}